

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O3

void __thiscall QGnomeThemePrivate::configureFonts(QGnomeThemePrivate *this,QString *gtkFontName)

{
  char16_t *pcVar1;
  qsizetype originalLength;
  QDebug QVar2;
  int iVar3;
  CutResult CVar4;
  QFont *pQVar5;
  QLoggingCategory *pQVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  float fVar9;
  QStringView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  char *local_80;
  QDebug local_70;
  QString local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (gtkFontName->d).ptr;
  originalLength = (gtkFontName->d).size;
  QVar10.m_data = pcVar1;
  QVar10.m_size = originalLength;
  iVar3 = QtPrivate::lastIndexOf(QVar10,-1,L' ',CaseSensitive);
  local_98._0_4_ = iVar3 + 1;
  local_98._4_4_ = (int)local_98 >> 0x1f;
  local_48.d.d = (Data *)0xffffffffffffffff;
  CVar4 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_98,(qsizetype *)&local_48);
  pcVar7 = (char16_t *)0x0;
  pDVar8 = (Data *)0x0;
  if (CVar4 != Null) {
    pcVar7 = pcVar1 + CONCAT44(local_98._4_4_,(int)local_98);
    pDVar8 = local_48.d.d;
  }
  local_98._0_4_ = (int)pDVar8;
  local_98._4_4_ = (int)((ulong)pDVar8 >> 0x20);
  uStack_90 = SUB84(pcVar7,0);
  uStack_8c = (undefined4)((ulong)pcVar7 >> 0x20);
  fVar9 = (float)QStringView::toFloat((bool *)&local_98);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::left(&local_68,gtkFontName,(long)iVar3);
  pQVar5 = (QFont *)operator_new(0x10);
  QFont::QFont(pQVar5,&local_68,(int)fVar9,-1,false);
  this->systemFont = pQVar5;
  pQVar5 = (QFont *)operator_new(0x10);
  QVar11.m_data = (storage_type *)0x9;
  QVar11.m_size = (qsizetype)&local_98;
  QString::fromLatin1(QVar11);
  local_48.d.d = (Data *)CONCAT44(local_98._4_4_,(int)local_98);
  local_48.d.ptr = (char16_t *)CONCAT44(uStack_8c,uStack_90);
  iVar3 = QFont::pointSize(this->systemFont);
  QFont::QFont(pQVar5,&local_48,iVar3,-1,false);
  this->fixedFont = pQVar5;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFont::setStyleHint(this->fixedFont,Courier,PreferDefault);
  pQVar6 = QtPrivateLogging::lcQpaFonts();
  if (((pQVar6->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_80 = pQVar6->name;
    local_98._0_4_ = 2;
    local_98._4_4_ = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_88 = 0;
    uStack_84 = 0;
    QMessageLogger::debug();
    QVar2.stream = local_70.stream;
    QVar12.m_data = (storage_type *)0x15;
    QVar12.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(&(QVar2.stream)->ts,(QString *)&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_70.stream)->space == true) {
      QTextStream::operator<<(&(local_70.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_70.stream)->ts,this->systemFont);
    if ((local_70.stream)->space == true) {
      QTextStream::operator<<(&(local_70.stream)->ts,' ');
    }
    QVar2.stream = local_70.stream;
    QVar13.m_data = &DAT_00000005;
    QVar13.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<(&(QVar2.stream)->ts,(QString *)&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_70.stream)->space == true) {
      QTextStream::operator<<(&(local_70.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_70.stream)->ts,this->fixedFont);
    if ((local_70.stream)->space == true) {
      QTextStream::operator<<(&(local_70.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_70);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGnomeThemePrivate::configureFonts(const QString &gtkFontName) const
{
    Q_ASSERT(!systemFont);
    const int split = gtkFontName.lastIndexOf(QChar::Space);
    float size = QStringView{gtkFontName}.mid(split + 1).toFloat();
    QString fontName = gtkFontName.left(split);

    systemFont = new QFont(fontName, size);
    fixedFont = new QFont(QLatin1StringView(QGenericUnixTheme::defaultFixedFontNameC), systemFont->pointSize());
    fixedFont->setStyleHint(QFont::TypeWriter);
    qCDebug(lcQpaFonts) << "default fonts: system" << systemFont << "fixed" << fixedFont;
}